

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chi_square_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::chi_square_dist<double>::operator()(chi_square_dist<double> *this,lcg64_shift *r)

{
  chi_square_dist<double> *in_RSI;
  result_type_conflict2 in_RDI;
  result_type_conflict2 rVar1;
  
  utility::uniformco<double,trng::lcg64_shift>((lcg64_shift *)0x351f21);
  rVar1 = icdf_(in_RSI,in_RDI);
  return rVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return icdf_(utility::uniformco<result_type>(r));
    }